

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O0

void __thiscall counted_functor::~counted_functor(counted_functor *this)

{
  add(this._4_4_);
  return;
}

Assistant:

~counted_functor() { add(-1); }